

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O1

bool __thiscall
Assimp::PLY::DOM::ParseHeader
          (DOM *this,IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
          bool isBinary)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Logger *pLVar3;
  Element out;
  value_type local_78;
  
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"PLY::DOM::ParseHeader() begin");
  paVar1 = &local_78.szName.field_2;
  do {
    if ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_start ==
        (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_finish) break;
    SkipComments(buffer);
    local_78.alProperties.
    super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.alProperties.
    super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.alProperties.
    super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.eSemantic = EEST_INVALID;
    local_78.szName._M_string_length = 0;
    local_78.szName.field_2._M_local_buf[0] = '\0';
    local_78.NumOccur = 0;
    local_78.szName._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = Element::ParseElement(streamBuffer,buffer,&local_78);
    if (bVar2) {
      bVar2 = true;
      std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>::push_back
                (&this->alElements,&local_78);
    }
    else {
      bVar2 = TokenMatch(buffer,"end_header",10);
      if (bVar2) {
        bVar2 = false;
      }
      else {
        bVar2 = true;
        IOStreamBuffer<char>::getNextLine(streamBuffer,buffer);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.szName._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.szName._M_dataplus._M_p,
                      CONCAT71(local_78.szName.field_2._M_allocated_capacity._1_7_,
                               local_78.szName.field_2._M_local_buf[0]) + 1);
    }
    std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::~vector
              (&local_78.alProperties);
  } while (bVar2);
  if (!isBinary) {
    SkipSpacesAndLineEnd(buffer);
  }
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"PLY::DOM::ParseHeader() succeeded");
  return true;
}

Assistant:

bool PLY::DOM::ParseHeader(IOStreamBuffer<char> &streamBuffer, std::vector<char> &buffer, bool isBinary) {
    ASSIMP_LOG_DEBUG("PLY::DOM::ParseHeader() begin");

  // parse all elements
  while (!buffer.empty())
  {
    // skip all comments
    PLY::DOM::SkipComments(buffer);

    PLY::Element out;
    if (PLY::Element::ParseElement(streamBuffer, buffer, &out))
    {
      // add the element to the list of elements
      alElements.push_back(out);
    }
    else if (TokenMatch(buffer, "end_header", 10))
    {
      // we have reached the end of the header
      break;
    }
    else
    {
      // ignore unknown header elements
      streamBuffer.getNextLine(buffer);
    }
  }

  if (!isBinary) // it would occur an error, if binary data start with values as space or line end.
    SkipSpacesAndLineEnd(buffer);

  ASSIMP_LOG_DEBUG("PLY::DOM::ParseHeader() succeeded");
  return true;
}